

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O1

Gia_Man_t * Cec_ManSatSweeping(Gia_Man_t *pAig,Cec_ParFra_t *pPars,int fSilent)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *pGVar8;
  Cec_ManFra_t *p;
  Cec_ManSim_t *p_00;
  Cec_ManPat_t *pPat;
  Gia_Man_t *pGVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Gia_Man_t *pGVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  timespec ts_1;
  uint local_cc;
  long local_c0;
  Cec_ParSat_t ParsSat;
  Cec_ParSim_t ParsSim;
  
  iVar5 = clock_gettime(3,(timespec *)&ParsSim);
  if (iVar5 < 0) {
    local_c0 = -1;
  }
  else {
    local_c0 = (long)ParsSim._8_8_ / 1000 + ParsSim._0_8_ * 1000000;
  }
  Gia_ManRandom(1);
  pGVar8 = Gia_ManDup(pAig);
  pGVar8->pReprs = pAig->pReprs;
  pAig->pReprs = (Gia_Rpr_t *)0x0;
  pGVar8->pNexts = pAig->pNexts;
  pAig->pNexts = (int *)0x0;
  p = Cec_ManFraStart(pGVar8,pPars);
  if (pPars->fDualOut != 0) {
    pPars->fColorDiff = 1;
  }
  ParsSim.fLatchCorr = 0;
  ParsSim.nRounds = 0x14;
  ParsSim.nNonRefines = 3;
  ParsSim.fConstCorr = 0;
  ParsSim.fVeryVerbose = 0;
  ParsSim.nWords = pPars->nWords;
  ParsSim.nFrames = pPars->nRounds;
  ParsSim.fSeqSimulate = 0;
  ParsSim.fCheckMiter = pPars->fCheckMiter;
  ParsSim._16_8_ = (ulong)(uint)pPars->fDualOut << 0x20;
  ParsSim.fVerbose = pPars->fVerbose;
  p_00 = Cec_ManSimStart(p->pAig,&ParsSim);
  ParsSat.nCallsRecycle = 200;
  ParsSat.fNonChrono = 0;
  ParsSat.fPolarFlip = 1;
  ParsSat.fCheckMiter = 0;
  ParsSat.nSatVarMax = 2000;
  ParsSat.nBTLimit = pPars->nBTLimit;
  ParsSat._24_8_ = (ulong)(uint)pPars->fVeryVerbose << 0x20;
  pPat = Cec_ManPatStart();
  pPat->fVerbose = pPars->fVeryVerbose;
  iVar5 = clock_gettime(3,(timespec *)&ts_1);
  if (iVar5 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_1.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts_1.tv_sec * -1000000;
  }
  if ((p->pAig->pReprs == (Gia_Rpr_t *)0x0) &&
     ((iVar5 = Cec_ManSimClassesPrepare(p_00,-1), iVar5 != 0 ||
      (iVar5 = Cec_ManSimClassesRefine(p_00), iVar5 != 0)))) {
    pGVar8 = p->pAig;
LAB_005c5125:
    Gia_ManStop(pGVar8);
    iVar5 = (int)pGVar8;
    p->pAig = (Gia_Man_t *)0x0;
  }
  else {
    iVar5 = 3;
    iVar6 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar6 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
    }
    p->timeSim = p->timeSim + lVar12 + lVar11;
    if (0 < pPars->nItersMax) {
      piVar1 = &pPars->fDualOut;
      piVar2 = &pPars->fColorDiff;
      local_cc = 0;
      do {
        iVar5 = clock_gettime(3,(timespec *)&ts_1);
        if (iVar5 < 0) {
          lVar11 = 1;
        }
        else {
          lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_1.tv_nsec),8);
          lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts_1.tv_sec * -1000000;
        }
        if (*piVar1 == 0) {
          uVar16 = 0;
        }
        else {
          uVar7 = Gia_ManEquivSetColors(p->pAig,pPars->fVeryVerbose);
          uVar16 = (ulong)uVar7;
        }
        pGVar8 = Cec_ManFraSpecReduction(p);
        if (pPars->fVeryVerbose != 0) {
          Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
        }
        local_cc = local_cc + 1;
        piVar10 = piVar1;
        if (pGVar8->vCos->nSize == 0) {
          Gia_ManStop(pGVar8);
          iVar5 = (int)pGVar8;
          if (p->pPars->fVerbose != 0) {
            Abc_Print(iVar5,"Considered all available candidate equivalences.\n");
          }
          bVar4 = true;
          if ((*piVar1 == 0) ||
             (pGVar8 = p->pAig, -2 < (pGVar8->vCis->nSize - pGVar8->nObjs) + pGVar8->vCos->nSize))
          goto LAB_005c561f;
          iVar6 = p->pPars->fVerbose;
          if (*piVar2 == 0) {
            if (iVar6 != 0) {
              Abc_Print(iVar5,"Switching into normal mode.\n");
            }
          }
          else {
joined_r0x005c52a0:
            piVar10 = piVar2;
            if (iVar6 != 0) {
              Abc_Print(iVar5,"Switching into reduced mode.\n");
            }
          }
LAB_005c55fc:
          *piVar10 = 0;
        }
        else {
          iVar5 = clock_gettime(3,(timespec *)&ts_1);
          if (iVar5 < 0) {
            lVar12 = 1;
          }
          else {
            lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_1.tv_nsec),8);
            lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts_1.tv_sec * -1000000;
          }
          if (pPars->fRunCSat == 0) {
            Cec_ManSatSolve(pPat,pGVar8,&ParsSat);
          }
          else {
            Cec_ManSatSolveCSat(pPat,pGVar8,&ParsSat);
          }
          iVar5 = clock_gettime(3,(timespec *)&ts_1);
          if (iVar5 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
          }
          p->timeSat = p->timeSat + lVar13 + lVar12;
          iVar5 = Cec_ManFraClassesUpdate(p,p_00,pPat,pGVar8);
          Gia_ManStop(pGVar8);
          pGVar8 = p->pAig;
          if (iVar5 != 0) goto LAB_005c5125;
          pGVar15 = pGVar8;
          pGVar9 = Gia_ManEquivReduceAndRemap(pGVar8,0,ParsSim.fDualOut);
          iVar5 = (int)pGVar15;
          p->pAig = pGVar9;
          p_00->pAig = pGVar9;
          if (pGVar9 == (Gia_Man_t *)0x0) {
            p->pAig = pGVar8;
            break;
          }
          Gia_ManStop(pGVar8);
          iVar5 = (int)pGVar8;
          if (p->pPars->fVerbose != 0) {
            pGVar8 = p->pAig;
            uVar7 = ~(pGVar8->vCos->nSize + pGVar8->vCis->nSize) + pGVar8->nObjs;
            Abc_Print(uVar7,"%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ",(ulong)local_cc,
                      (ulong)(uint)p->nAllProved,(ulong)(uint)p->nAllDisproved,
                      (ulong)(uint)p->nAllFailed,uVar16,(ulong)uVar7);
            iVar5 = 3;
            iVar6 = clock_gettime(3,(timespec *)&ts_1);
            if (iVar6 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
            }
            Abc_Print(iVar5,"%s =","Time");
            Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(lVar12 + lVar11) / 1000000.0,0));
          }
          pGVar8 = p->pAig;
          if (pGVar8->nObjs == pGVar8->vCis->nSize + pGVar8->vCos->nSize + 1) {
            bVar4 = true;
            if (p->pPars->fVerbose != 0) {
              Abc_Print(iVar5,"Network after reduction is empty.\n");
            }
            goto LAB_005c561f;
          }
          if (p->pPars->TimeLimit != 0) {
            iVar5 = 3;
            iVar6 = clock_gettime(3,(timespec *)&ts_1);
            if (iVar6 < 0) {
              lVar11 = -1;
            }
            else {
              lVar11 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
            }
            if ((long)p->pPars->TimeLimit <= (lVar11 - local_c0) / 1000000) {
              bVar4 = false;
              goto LAB_005c561f;
            }
          }
          if (p->nAllDisproved + p->nAllProved < p->nAllFailed) {
            bVar4 = true;
            if (10000 < ParsSat.nBTLimit) goto LAB_005c561f;
            if (pPars->fSatSweeping != 0) {
              if (p->pPars->fVerbose != 0) {
                Abc_Print(iVar5,"Exceeded the limit on the number of conflicts (%d).\n");
              }
              goto LAB_005c561f;
            }
            ParsSat.nBTLimit = ParsSat.nBTLimit * 10;
            if (p->pPars->fVerbose != 0) {
              Abc_Print(iVar5,"Increasing conflict limit to %d.\n");
            }
          }
          if (*piVar1 != 0) {
            if ((*piVar2 != 0) &&
               ((pGVar8 = p->pAig,
                -0x186a1 < (pGVar8->vCis->nSize - pGVar8->nObjs) + pGVar8->vCos->nSize ||
                (p->nAllDisproved + p->nAllProved < 10)))) {
              iVar6 = p->pPars->fVerbose;
              goto joined_r0x005c52a0;
            }
            if ((*piVar1 != 0) &&
               ((pGVar8 = p->pAig,
                -0x4e21 < (pGVar8->vCis->nSize - pGVar8->nObjs) + pGVar8->vCos->nSize ||
                (p->nAllDisproved + p->nAllProved < 10)))) {
              if (p->pPars->fVerbose != 0) {
                Abc_Print(iVar5,"Switching into normal mode.\n");
              }
              pPars->fColorDiff = 0;
              goto LAB_005c55fc;
            }
          }
        }
      } while ((int)local_cc < pPars->nItersMax);
    }
  }
  bVar4 = true;
LAB_005c561f:
  if ((p->pPars->fVerbose != 0) && (pGVar8 = p->pAig, pGVar8 != (Gia_Man_t *)0x0)) {
    iVar6 = ~(pAig->vCos->nSize + pAig->vCis->nSize) + pAig->nObjs;
    dVar18 = 1.0;
    dVar17 = 1.0;
    if (iVar6 != 0) {
      dVar17 = (double)iVar6;
    }
    iVar3 = pAig->nRegs;
    if (iVar3 != 0) {
      dVar18 = (double)iVar3;
    }
    Abc_Print(iVar5,
              "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
              ,SUB84(((double)(iVar6 - (~(pGVar8->vCos->nSize + pGVar8->vCis->nSize) + pGVar8->nObjs
                                       )) * 100.0) / dVar17,0),
              ((double)(iVar3 - pGVar8->nRegs) * 100.0) / dVar18);
    lVar11 = p->timeSim;
    iVar6 = 3;
    iVar5 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar5 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
    }
    lVar13 = (long)(int)local_c0;
    Abc_Print(iVar6,"%s =","Sim ");
    dVar17 = 0.0;
    if (lVar12 - lVar13 != 0) {
      dVar17 = ((double)lVar11 * 100.0) / (double)(lVar12 - lVar13);
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84((double)lVar11 / 1000000.0,0),dVar17);
    lVar11 = p->timeSat;
    lVar12 = pPat->timeTotalSave;
    iVar6 = 3;
    iVar5 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar5 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%s =","Sat ");
    dVar17 = (double)(lVar11 - lVar12);
    dVar18 = 0.0;
    if (lVar14 - lVar13 != 0) {
      dVar18 = (dVar17 * 100.0) / (double)(lVar14 - lVar13);
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84(dVar17 / 1000000.0,0),dVar18);
    lVar11 = pPat->timeTotalSave;
    lVar12 = p->timePat;
    iVar6 = 3;
    iVar5 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar5 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%s =","Pat ");
    dVar17 = (double)(lVar11 + lVar12);
    dVar18 = 0.0;
    if (lVar14 - lVar13 != 0) {
      dVar18 = (dVar17 * 100.0) / (double)(lVar14 - lVar13);
    }
    Abc_Print(iVar6,"%9.2f sec (%6.2f %%)\n",SUB84(dVar17 / 1000000.0,0),dVar18);
    iVar5 = 3;
    iVar6 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar6 < 0) {
      iVar6 = -1;
    }
    else {
      iVar6 = (int)(ts_1.tv_nsec / 1000) + (int)ts_1.tv_sec * 1000000;
    }
    Abc_Print(iVar5,"%s =","Time");
    Abc_Print(iVar5,"%9.2f sec\n",SUB84((double)(iVar6 - (int)local_c0) / 1000000.0,0));
  }
  pGVar8 = p->pAig;
  p->pAig = (Gia_Man_t *)0x0;
  if ((pGVar8 == (Gia_Man_t *)0x0) && (-1 < p_00->iOut)) {
    if (fSilent == 0) {
      Abc_Print(iVar5,"Disproved at least one output of the miter (zero-based number %d).\n");
    }
    pPars->iOutFail = p_00->iOut;
  }
  else if ((fSilent == 0) && (p_00->pCexes != (void **)0x0)) {
    Abc_Print(iVar5,"Disproved %d outputs of the miter.\n",(ulong)(uint)p_00->nOuts);
  }
  if (fSilent == 0 && !bVar4) {
    iVar6 = 3;
    iVar5 = clock_gettime(3,(timespec *)&ts_1);
    if (iVar5 < 0) {
      dVar17 = -1.0;
    }
    else {
      dVar17 = (double)(ts_1.tv_nsec / 1000 + ts_1.tv_sec * 1000000);
    }
    Abc_Print(iVar6,"Timed out after %d seconds.\n",
              (long)((int)(dVar17 - (double)local_c0) / 1000000));
  }
  pAig->pCexComb = p_00->pCexComb;
  p_00->pCexComb = (Abc_Cex_t *)0x0;
  Cec_ManSimStop(p_00);
  Cec_ManPatStop(pPat);
  Cec_ManFraStop(p);
  return pGVar8;
}

Assistant:

Gia_Man_t * Cec_ManSatSweeping( Gia_Man_t * pAig, Cec_ParFra_t * pPars, int fSilent )
{
    int fOutputResult = 0;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Gia_Man_t * pIni, * pSrm, * pTemp;
    Cec_ManFra_t * p;
    Cec_ManSim_t * pSim;
    Cec_ManPat_t * pPat;
    int i, fTimeOut = 0, nMatches = 0;
    abctime clk, clk2, clkTotal = Abc_Clock();

    // duplicate AIG and transfer equivalence classes
    Gia_ManRandom( 1 );
    pIni = Gia_ManDup(pAig);
    pIni->pReprs = pAig->pReprs; pAig->pReprs = NULL;
    pIni->pNexts = pAig->pNexts; pAig->pNexts = NULL;

    // prepare the managers
    // SAT sweeping
    p = Cec_ManFraStart( pIni, pPars );
    if ( pPars->fDualOut )
        pPars->fColorDiff = 1;
    // simulation
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords      = pPars->nWords;
    pParsSim->nFrames     = pPars->nRounds;
    pParsSim->fCheckMiter = pPars->fCheckMiter;
    pParsSim->fDualOut    = pPars->fDualOut;
    pParsSim->fVerbose    = pPars->fVerbose;
    pSim = Cec_ManSimStart( p->pAig, pParsSim );
    // SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVeryVerbose;
    // simulation patterns
    pPat = Cec_ManPatStart();
    pPat->fVerbose = pPars->fVeryVerbose;

    // start equivalence classes
clk = Abc_Clock();
    if ( p->pAig->pReprs == NULL )
    {
        if ( Cec_ManSimClassesPrepare(pSim, -1) || Cec_ManSimClassesRefine(pSim) )
        {
            Gia_ManStop( p->pAig );
            p->pAig = NULL;
            goto finalize;
        }
    }
p->timeSim += Abc_Clock() - clk;
    // perform solving
    for ( i = 1; i <= pPars->nItersMax; i++ )
    {
        clk2 = Abc_Clock();
        nMatches = 0;
        if ( pPars->fDualOut )
        {
            nMatches = Gia_ManEquivSetColors( p->pAig, pPars->fVeryVerbose );
//            p->pAig->pIso = Cec_ManDetectIsomorphism( p->pAig );
//            Gia_ManEquivTransform( p->pAig, 1 );
        }
        pSrm = Cec_ManFraSpecReduction( p ); 

//        Gia_AigerWrite( pSrm, "gia_srm.aig", 0, 0 );

        if ( pPars->fVeryVerbose )
            Gia_ManPrintStats( pSrm, NULL );
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            Gia_ManStop( pSrm );
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Considered all available candidate equivalences.\n" );
            if ( pPars->fDualOut && Gia_ManAndNum(p->pAig) > 0 )
            {
                if ( pPars->fColorDiff )
                {
                    if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Switching into reduced mode.\n" );
                    pPars->fColorDiff = 0;
                }
                else
                {
                    if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Switching into normal mode.\n" );
                    pPars->fDualOut = 0;
                }
                continue;
            }
            break;
        }
clk = Abc_Clock();
        if ( pPars->fRunCSat )
            Cec_ManSatSolveCSat( pPat, pSrm, pParsSat ); 
        else
            Cec_ManSatSolve( pPat, pSrm, pParsSat ); 
p->timeSat += Abc_Clock() - clk;
        if ( Cec_ManFraClassesUpdate( p, pSim, pPat, pSrm ) )
        {
            Gia_ManStop( pSrm );
            Gia_ManStop( p->pAig );
            p->pAig = NULL;
            goto finalize;
        }
        Gia_ManStop( pSrm );

        // update the manager
        pSim->pAig = p->pAig = Gia_ManEquivReduceAndRemap( pTemp = p->pAig, 0, pParsSim->fDualOut );
        if ( p->pAig == NULL )
        {
            p->pAig = pTemp;
            break;
        }
        Gia_ManStop( pTemp );
        if ( p->pPars->fVerbose )
        {
            Abc_Print( 1, "%3d : P =%7d. D =%7d. F =%6d. M = %7d. And =%8d. ", 
                i, p->nAllProved, p->nAllDisproved, p->nAllFailed, nMatches, Gia_ManAndNum(p->pAig) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
        if ( Gia_ManAndNum(p->pAig) == 0 )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Network after reduction is empty.\n" );
            break;
        }
        // check resource limits
        if ( p->pPars->TimeLimit && (Abc_Clock() - clkTotal)/CLOCKS_PER_SEC >= p->pPars->TimeLimit )
        {
            fTimeOut = 1;
            break;
        }
//        if ( p->nAllFailed && !p->nAllProved && !p->nAllDisproved )
        if ( p->nAllFailed > p->nAllProved + p->nAllDisproved )
        {
            if ( pParsSat->nBTLimit >= 10001 )
                break;
            if ( pPars->fSatSweeping )
            {
                if ( p->pPars->fVerbose )
                    Abc_Print( 1, "Exceeded the limit on the number of conflicts (%d).\n", pParsSat->nBTLimit );
                break;
            }
            pParsSat->nBTLimit *= 10;
            if ( p->pPars->fVerbose )
            {
                if ( p->pPars->fVerbose )
                    Abc_Print( 1, "Increasing conflict limit to %d.\n", pParsSat->nBTLimit );
                if ( fOutputResult )
                {
                    Gia_AigerWrite( p->pAig, "gia_cec_temp.aig", 0, 0 );
                    Abc_Print( 1,"The result is written into file \"%s\".\n", "gia_cec_temp.aig" );
                }
            }
        }
        if ( pPars->fDualOut && pPars->fColorDiff && (Gia_ManAndNum(p->pAig) < 100000 || p->nAllProved + p->nAllDisproved < 10) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Switching into reduced mode.\n" );
            pPars->fColorDiff = 0;
        }
//        if ( pPars->fDualOut && Gia_ManAndNum(p->pAig) < 20000 )
        else if ( pPars->fDualOut && (Gia_ManAndNum(p->pAig) < 20000 || p->nAllProved + p->nAllDisproved < 10) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Switching into normal mode.\n" );
            pPars->fColorDiff = 0;
            pPars->fDualOut = 0;
        }
    }
finalize:
    if ( p->pPars->fVerbose && p->pAig )
    {
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(p->pAig), 
            100.0*(Gia_ManAndNum(pAig)-Gia_ManAndNum(p->pAig))/(Gia_ManAndNum(pAig)?Gia_ManAndNum(pAig):1), 
            Gia_ManRegNum(pAig), Gia_ManRegNum(p->pAig), 
            100.0*(Gia_ManRegNum(pAig)-Gia_ManRegNum(p->pAig))/(Gia_ManRegNum(pAig)?Gia_ManRegNum(pAig):1) );
        Abc_PrintTimeP( 1, "Sim ", p->timeSim, Abc_Clock() - (int)clkTotal );
        Abc_PrintTimeP( 1, "Sat ", p->timeSat-pPat->timeTotalSave, Abc_Clock() - (int)clkTotal );
        Abc_PrintTimeP( 1, "Pat ", p->timePat+pPat->timeTotalSave, Abc_Clock() - (int)clkTotal );
        Abc_PrintTime( 1, "Time", (int)(Abc_Clock() - clkTotal) );
    }

    pTemp = p->pAig; p->pAig = NULL;
    if ( pTemp == NULL && pSim->iOut >= 0 )
    {
        if ( !fSilent )
        Abc_Print( 1, "Disproved at least one output of the miter (zero-based number %d).\n", pSim->iOut );
        pPars->iOutFail = pSim->iOut;
    }
    else if ( pSim->pCexes && !fSilent )
        Abc_Print( 1, "Disproved %d outputs of the miter.\n", pSim->nOuts );
    if ( fTimeOut && !fSilent )
        Abc_Print( 1, "Timed out after %d seconds.\n", (int)((double)Abc_Clock() - clkTotal)/CLOCKS_PER_SEC );

    pAig->pCexComb = pSim->pCexComb; pSim->pCexComb = NULL;
    Cec_ManSimStop( pSim );
    Cec_ManPatStop( pPat );
    Cec_ManFraStop( p );
    return pTemp;
}